

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledVertical.cpp
# Opt level: O2

DecoratorDataHandle __thiscall
Rml::DecoratorTiledVertical::GenerateElementData
          (DecoratorTiledVertical *this,Element *element,BoxArea paint_area)

{
  undefined1 *this_00;
  undefined1 *this_01;
  undefined1 *this_02;
  Vector2f surface_origin;
  Vector2f surface_origin_00;
  Vector2f surface_dimensions;
  Vector2f surface_origin_01;
  uint num_textures;
  ComputedValues *computed;
  DecoratorTiledVerticalData *this_03;
  RenderManager *mesh_00;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  float fVar4;
  float minimum_height;
  float fVar5;
  Texture texture;
  Vector2f bottom_dimensions;
  float local_168;
  float fStack_164;
  Vector2f top_dimensions;
  Vector2f centre_dimensions;
  Mesh mesh [3];
  RenderBox render_box;
  
  this_00 = &this->field_0x30;
  for (lVar2 = 0x30; lVar2 != 0x114; lVar2 = lVar2 + 0x4c) {
    texture = Decorator::GetTexture
                        ((Decorator *)this,
                         *(int *)((long)&(this->super_DecoratorTiled).super_Decorator.
                                         _vptr_Decorator + lVar2));
    DecoratorTiled::Tile::CalculateDimensions
              ((Tile *)((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar2)
               ,texture);
  }
  Element::GetRenderBox(&render_box,element,paint_area,0);
  top_dimensions = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)this_00,element);
  this_01 = &this->field_0x7c;
  bottom_dimensions = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)this_01,element);
  this_02 = &this->field_0xc8;
  centre_dimensions = DecoratorTiled::Tile::GetNaturalDimensions((Tile *)this_02,element);
  local_168 = render_box.fill_size.x;
  DecoratorTiled::ScaleTileDimensions
            (&this->super_DecoratorTiled,&top_dimensions,local_168,Horizontal);
  DecoratorTiled::ScaleTileDimensions
            (&this->super_DecoratorTiled,&bottom_dimensions,local_168,Horizontal);
  DecoratorTiled::ScaleTileDimensions
            (&this->super_DecoratorTiled,&centre_dimensions,local_168,Horizontal);
  fVar4 = Math::Round(top_dimensions.y);
  top_dimensions.y = fVar4;
  fVar4 = Math::Round(bottom_dimensions.y);
  fStack_164 = render_box.fill_size.y;
  fVar5 = fVar4 + top_dimensions.y;
  if (fStack_164 < fVar5) {
    top_dimensions.y = (top_dimensions.y / fVar5) * fStack_164;
    fVar4 = (fVar4 / fVar5) * fStack_164;
  }
  bottom_dimensions.y = fVar4;
  computed = Element::GetComputedValues(element);
  memset(mesh,0,0x90);
  surface_origin_01.y = render_box.border_widths._M_elems[0];
  surface_origin_01.x = render_box.border_widths._M_elems[3];
  DecoratorTiled::Tile::GenerateGeometry
            ((Tile *)this_00,mesh + *(int *)this_00,computed,surface_origin_01,top_dimensions,
             top_dimensions);
  surface_origin.y = render_box.border_widths._M_elems[0] + top_dimensions.y;
  surface_origin.x = render_box.border_widths._M_elems[3] + 0.0;
  surface_dimensions.y = fStack_164 - (top_dimensions.y + bottom_dimensions.y);
  surface_dimensions.x = centre_dimensions.x;
  DecoratorTiled::Tile::GenerateGeometry
            ((Tile *)this_02,mesh + *(int *)this_02,computed,surface_origin,surface_dimensions,
             centre_dimensions);
  surface_origin_00.y = render_box.border_widths._M_elems[0] + (fStack_164 - bottom_dimensions.y);
  surface_origin_00.x = render_box.border_widths._M_elems[3] + 0.0;
  DecoratorTiled::Tile::GenerateGeometry
            ((Tile *)this_01,mesh + *(int *)this_01,computed,surface_origin_00,bottom_dimensions,
             bottom_dimensions);
  num_textures = Decorator::GetNumTextures((Decorator *)this);
  this_03 = (DecoratorTiledVerticalData *)operator_new(0x10);
  DecoratorTiledVerticalData::DecoratorTiledVerticalData(this_03,num_textures);
  mesh_00 = Element::GetRenderManager(element);
  uVar1 = 0;
  uVar3 = (ulong)num_textures;
  if ((int)num_textures < 1) {
    uVar3 = uVar1;
  }
  for (; uVar3 * 0x10 != uVar1; uVar1 = uVar1 + 0x10) {
    RenderManager::MakeGeometry((RenderManager *)&stack0xfffffffffffffef8,(Mesh *)mesh_00);
    UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ::operator=((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                 *)((long)&(this_03->geometry->
                           super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                           ).render_manager + uVar1),
                (UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                 *)&stack0xfffffffffffffef8);
    UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ::~UniqueRenderResource
              ((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                *)&stack0xfffffffffffffef8);
  }
  lVar2 = 0x60;
  do {
    Mesh::~Mesh((Mesh *)((long)&mesh[0].vertices.
                                super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + -0x30;
  } while (lVar2 != -0x30);
  return (DecoratorDataHandle)this_03;
}

Assistant:

DecoratorDataHandle DecoratorTiledVertical::GenerateElementData(Element* element, BoxArea paint_area) const
{
	// Initialise the tile for this element.
	for (int i = 0; i < 3; i++)
		tiles[i].CalculateDimensions(GetTexture(tiles[i].texture_index));

	const RenderBox render_box = element->GetRenderBox(paint_area);
	const Vector2f offset = render_box.GetFillOffset();
	const Vector2f size = render_box.GetFillSize();

	Vector2f top_dimensions = tiles[TOP].GetNaturalDimensions(element);
	Vector2f bottom_dimensions = tiles[BOTTOM].GetNaturalDimensions(element);
	Vector2f centre_dimensions = tiles[CENTRE].GetNaturalDimensions(element);

	// Scale the tile sizes by the width scale.
	ScaleTileDimensions(top_dimensions, size.x, Axis::Horizontal);
	ScaleTileDimensions(bottom_dimensions, size.x, Axis::Horizontal);
	ScaleTileDimensions(centre_dimensions, size.x, Axis::Horizontal);

	// Round the outer tile heights now so that we don't get gaps when rounding again in GenerateGeometry.
	top_dimensions.y = Math::Round(top_dimensions.y);
	bottom_dimensions.y = Math::Round(bottom_dimensions.y);

	// Shrink the y-sizes on the left and right tiles if necessary.
	if (size.y < top_dimensions.y + bottom_dimensions.y)
	{
		float minimum_height = top_dimensions.y + bottom_dimensions.y;
		top_dimensions.y = size.y * (top_dimensions.y / minimum_height);
		bottom_dimensions.y = size.y * (bottom_dimensions.y / minimum_height);
	}

	const ComputedValues& computed = element->GetComputedValues();
	Mesh mesh[COUNT];

	tiles[TOP].GenerateGeometry(mesh[tiles[TOP].texture_index], computed, offset, top_dimensions, top_dimensions);

	tiles[CENTRE].GenerateGeometry(mesh[tiles[CENTRE].texture_index], computed, offset + Vector2f(0, top_dimensions.y),
		Vector2f(centre_dimensions.x, size.y - (top_dimensions.y + bottom_dimensions.y)), centre_dimensions);

	tiles[BOTTOM].GenerateGeometry(mesh[tiles[BOTTOM].texture_index], computed, offset + Vector2f(0, size.y - bottom_dimensions.y), bottom_dimensions,
		bottom_dimensions);

	const int num_textures = GetNumTextures();
	DecoratorTiledVerticalData* data = new DecoratorTiledVerticalData(num_textures);

	// Set the mesh and textures on the geometry.
	RenderManager* render_manager = element->GetRenderManager();
	for (int i = 0; i < num_textures; i++)
		data->geometry[i] = render_manager->MakeGeometry(std::move(mesh[i]));

	return reinterpret_cast<DecoratorDataHandle>(data);
}